

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O0

void rtree_clear(tsdn_t *tsdn,rtree_t *rtree,rtree_ctx_t *rtree_ctx,uintptr_t key)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong in_RCX;
  long in_RDX;
  rtree_t *in_RSI;
  tsdn_t *in_RDI;
  rtree_leaf_elm_t *elm;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar4;
  rtree_ctx_t *in_stack_fffffffffffffef0;
  rtree_t *in_stack_fffffffffffffef8;
  tsdn_t *in_stack_ffffffffffffff00;
  undefined8 local_b8;
  
  uVar2 = in_RCX >> 0x1e & 0xf;
  uVar3 = in_RCX & 0xffffffffc0000000;
  if (*(ulong *)(in_RDX + uVar2 * 0x10) == uVar3) {
    local_b8 = (rtree_leaf_elm_t *)
               (*(long *)(in_RDX + uVar2 * 0x10 + 8) + (in_RCX >> 0xc & 0x3ffff) * 8);
  }
  else if (*(ulong *)(in_RDX + 0x100) == uVar3) {
    lVar1 = *(long *)(in_RDX + 0x108);
    *(undefined8 *)(in_RDX + 0x100) = *(undefined8 *)(in_RDX + uVar2 * 0x10);
    *(undefined8 *)(in_RDX + 0x108) = *(undefined8 *)(in_RDX + uVar2 * 0x10 + 8);
    *(ulong *)(in_RDX + uVar2 * 0x10) = uVar3;
    *(long *)(in_RDX + uVar2 * 0x10 + 8) = lVar1;
    local_b8 = (rtree_leaf_elm_t *)(lVar1 + (in_RCX >> 0xc & 0x3ffff) * 8);
  }
  else {
    for (uVar4 = 1; uVar4 < 8; uVar4 = uVar4 + 1) {
      if (*(ulong *)(in_RDX + 0x100 + (ulong)uVar4 * 0x10) == uVar3) {
        lVar1 = *(long *)(in_RDX + (ulong)uVar4 * 0x10 + 0x108);
        if (uVar4 == 0) {
          *(undefined8 *)(in_RDX + 0x100) = *(undefined8 *)(in_RDX + uVar2 * 0x10);
          *(undefined8 *)(in_RDX + 0x108) = *(undefined8 *)(in_RDX + uVar2 * 0x10 + 8);
        }
        else {
          *(undefined8 *)(in_RDX + 0x100 + (ulong)uVar4 * 0x10) =
               *(undefined8 *)(in_RDX + 0x100 + (ulong)(uVar4 - 1) * 0x10);
          *(undefined8 *)(in_RDX + (ulong)uVar4 * 0x10 + 0x108) =
               *(undefined8 *)(in_RDX + (ulong)(uVar4 - 1) * 0x10 + 0x108);
          *(undefined8 *)(in_RDX + 0x100 + (ulong)(uVar4 - 1) * 0x10) =
               *(undefined8 *)(in_RDX + uVar2 * 0x10);
          *(undefined8 *)(in_RDX + (ulong)(uVar4 - 1) * 0x10 + 0x108) =
               *(undefined8 *)(in_RDX + uVar2 * 0x10 + 8);
        }
        *(ulong *)(in_RDX + uVar2 * 0x10) = uVar3;
        *(long *)(in_RDX + uVar2 * 0x10 + 8) = lVar1;
        local_b8 = (rtree_leaf_elm_t *)(lVar1 + (in_RCX >> 0xc & 0x3ffff) * 8);
        goto LAB_0016f9cd;
      }
    }
    local_b8 = rtree_leaf_elm_lookup_hard
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef0,CONCAT44(uVar4,in_stack_fffffffffffffee8),
                          SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffee0 >> 0x30,0));
  }
LAB_0016f9cd:
  rtree_leaf_elm_write(in_RDI,in_RSI,local_b8,(extent_t *)0x0,0xe8,false);
  return;
}

Assistant:

static inline void
rtree_clear(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx,
    uintptr_t key) {
	rtree_leaf_elm_t *elm = rtree_read(tsdn, rtree, rtree_ctx, key, true);
	assert(rtree_leaf_elm_extent_read(tsdn, rtree, elm, false) !=
	    NULL);
	rtree_leaf_elm_write(tsdn, rtree, elm, NULL, SC_NSIZES, false);
}